

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsort.c
# Opt level: O3

sexp_sint_t sexp_object_compare(sexp_conflict ctx,sexp_conflict a,sexp_conflict b,int depth)

{
  sexp_tag_t sVar1;
  sexp psVar2;
  uint uVar3;
  int iVar4;
  sexp_conflict psVar5;
  sexp_sint_t sVar6;
  long lVar7;
  long lVar8;
  sbyte sVar9;
  uint uVar10;
  ulong uVar11;
  char *__s2;
  char cVar12;
  char cVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  char *pcVar17;
  bool bVar18;
  
  if (a != b) {
    do {
      if (((ulong)a & 3) != 0) {
        if (((ulong)b & 3) == 0) {
          if ((((ulong)a & 1) == 0) || (2 < b->tag - 0xb)) {
            if (((uint)a & 0xf) != 6) {
              return -1;
            }
            if (b->tag != 7) {
              return -1;
            }
            lVar8 = sexp_write_to_string(ctx,a);
            lVar8 = *(long *)(lVar8 + 8);
            lVar7 = sexp_write_to_string(ctx,a);
            a = (sexp_conflict)(lVar8 + *(long *)(lVar7 + 0x10));
LAB_00101960:
            pcVar17 = (a->value).flonum_bits + 8;
            __s2 = (b->value).flonum_bits + 8;
LAB_00101963:
            iVar4 = strcmp(pcVar17,__s2);
            return (long)iVar4;
          }
LAB_001018de:
          lVar8 = sexp_compare(ctx,a,b);
LAB_0010197d:
          return lVar8 >> 1;
        }
        if ((((uint)a & 0xf) != 6) || (((uint)b & 0xf) != 6)) {
          return (long)a - (long)b;
        }
        uVar11 = (ulong)a >> 4;
        uVar14 = (ulong)b >> 4;
        goto LAB_00101423;
      }
      if (((ulong)b & 3) != 0) {
        if ((((ulong)b & 1) == 0) || (2 < a->tag - 0xb)) {
          if (((uint)b & 0xf) != 6) {
            return 1;
          }
          if (a->tag != 7) {
            return 1;
          }
          pcVar17 = (a->value).flonum_bits + 8;
          lVar8 = sexp_write_to_string(ctx,b);
          lVar8 = *(long *)(lVar8 + 8);
          lVar7 = sexp_write_to_string(ctx,b);
          __s2 = (char *)(lVar8 + *(long *)(lVar7 + 0x10) + 0x10);
          goto LAB_00101963;
        }
        goto LAB_001018de;
      }
      sVar1 = a->tag;
      uVar3 = sVar1 - b->tag;
      if (uVar3 != 0) {
        if (2 < sVar1 - 0xb) {
          return (ulong)uVar3;
        }
        if (2 < b->tag - 0xb) {
          return (ulong)uVar3;
        }
        goto LAB_001018de;
      }
      if (depth < 1) {
        return 0;
      }
      switch(sVar1) {
      case 6:
        psVar5 = (a->value).type.cpl;
        if ((a == psVar5) || (a->tag != 6)) {
          sVar6 = 0;
          bVar18 = false;
        }
        else {
          bVar18 = false;
          while (b->tag == 6) {
            sVar6 = sexp_object_compare(ctx,(a->value).type.name,(b->value).type.name,depth + -1);
            if ((((ulong)psVar5 & 3) == 0) && (psVar5->tag == 6)) {
              psVar2 = (psVar5->value).type.cpl;
              psVar5 = (sexp_conflict)&DAT_0000023e;
              if ((((ulong)psVar2 & 3) == 0) && (psVar5 = psVar2, psVar2->tag != 6)) {
                psVar5 = (sexp_conflict)&DAT_0000023e;
              }
            }
            else {
              psVar5 = (sexp_conflict)&DAT_0000023e;
            }
            a = (a->value).type.cpl;
            b = (sexp_conflict)(b->value).string.offset;
            bVar18 = sVar6 != 0;
            if (((bVar18) || (a == psVar5)) || (((ulong)a & 3) != 0)) goto LAB_00101332;
            if (a->tag != 6) break;
            sVar6 = 0;
            if (((ulong)b & 3) != 0) goto LAB_00101332;
          }
          sVar6 = 0;
        }
LAB_00101332:
        if ((((ulong)psVar5 & 3) == 0) && (psVar5->tag == 6)) {
          if (((ulong)b & 3) != 0) {
            return 1;
          }
          if (b->tag != 6) {
            return 1;
          }
        }
        if ((((ulong)b & 3) == 0) && (b->tag == 6)) {
          if (((ulong)psVar5 & 3) != 0) {
            return -1;
          }
          if (psVar5->tag != 6) {
            return -1;
          }
        }
        if (bVar18 || b == (sexp_conflict)&DAT_0000023e && a == (sexp_conflict)&DAT_0000023e) {
          if (b == (sexp_conflict)&DAT_0000023e && a == (sexp_conflict)&DAT_0000023e) {
            return 0;
          }
          return sVar6;
        }
        break;
      case 7:
        goto LAB_00101960;
      default:
        return 0;
      case 9:
        pcVar17 = (((a->value).type.cpl)->value).flonum_bits +
                  (long)(((a->value).type.name)->value).flonum_bits;
        __s2 = (((b->value).type.cpl)->value).flonum_bits +
               (long)(((b->value).type.name)->value).flonum_bits;
        goto LAB_00101963;
      case 10:
        psVar2 = (a->value).type.name;
        lVar8 = (long)psVar2 - (b->value).stack.length;
        if ((long)psVar2 < 1 || lVar8 != 0) {
          return lVar8;
        }
        lVar8 = 1;
        do {
          sVar6 = sexp_object_compare(ctx,*(sexp_conflict *)((long)&a->value + lVar8 * 8),
                                      *(sexp_conflict *)((long)&b->value + lVar8 * 8),depth + -1);
          if (sVar6 != 0) {
            return sVar6;
          }
          bVar18 = lVar8 < (long)psVar2;
          lVar8 = lVar8 + 1;
        } while (bVar18);
        return 0;
      case 0xb:
        if ((a->value).flonum <= (b->value).flonum) {
          return -(ulong)((a->value).flonum < (b->value).flonum);
        }
        return 1;
      case 0xc:
        sVar6 = sexp_bignum_compare(a,b);
        return sVar6;
      case 0xd:
        lVar8 = sexp_ratio_compare(ctx,a,b);
        goto LAB_0010197d;
      case 0xe:
        sVar6 = sexp_object_compare(ctx,(a->value).type.name,(b->value).type.name,depth + -1);
        if (sVar6 != 0) {
          return sVar6;
        }
        a = (a->value).type.cpl;
        b = (b->value).type.cpl;
      }
      depth = depth + -1;
    } while (a != b);
  }
  return 0;
LAB_00101423:
  do {
    if ((uVar11 == 0) || (uVar14 == 0)) {
      iVar4 = 1;
      if (uVar11 == 0) {
        iVar4 = -(uint)(uVar14 != 0);
      }
      break;
    }
    uVar15 = uVar11 >> 3;
    uVar3 = (uint)uVar15;
    switch((uint)uVar11 & 7) {
    case 0:
      uVar15 = uVar11 >> 5;
      uVar10 = (uint)uVar15;
      if ((uVar11 & 0x18) != 0) {
        cVar12 = _huff_tab9[uVar3 & 3];
        if (cVar12 == '\0') {
          pcVar17 = _huff_tab10 + (uVar10 & 3);
          goto LAB_001014fc;
        }
        goto LAB_00101619;
      }
      uVar15 = uVar11 >> 7;
      uVar3 = (uint)uVar15;
      if ((uVar11 & 0x60) != 0) {
        cVar12 = _huff_tab11[uVar10 & 3];
        if (cVar12 != '\0') goto LAB_00101619;
        pcVar17 = _huff_tab12 + (uVar3 & 1);
        sVar9 = 8;
        goto LAB_00101613;
      }
      uVar15 = uVar11 >> 10;
      uVar10 = (uint)uVar15;
      switch(uVar3 & 7) {
      case 0:
        uVar15 = uVar11 >> 0xc;
        if ((uVar11 & 0xc00) == 0) {
          pcVar17 = _huff_tab21 + ((uint)uVar15 & 7);
        }
        else {
          cVar12 = _huff_tab19[uVar10 & 3];
          if (cVar12 != '\x01') goto LAB_00101619;
          pcVar17 = _huff_tab20 + ((uint)uVar15 & 7);
        }
        sVar9 = 0xf;
        break;
      case 1:
        pcVar17 = _huff_tab18 + (uVar10 & 0xf);
        goto LAB_0010160b;
      case 2:
        pcVar17 = _huff_tab17 + (uVar10 & 0x1f);
        sVar9 = 0xf;
        break;
      default:
        cVar12 = _huff_tab13[uVar3 & 7];
        if (cVar12 != '\0') goto LAB_00101619;
        pcVar17 = _huff_tab14 + (uVar10 & 1);
        sVar9 = 0xb;
        break;
      case 4:
        pcVar17 = _huff_tab16 + (uVar10 & 0xf);
        goto LAB_0010160b;
      case 5:
        pcVar17 = _huff_tab15 + (uVar10 & 0xf);
LAB_0010160b:
        sVar9 = 0xe;
      }
      goto LAB_00101613;
    case 1:
      pcVar17 = _huff_tab8 + (uVar3 & 3);
      sVar9 = 5;
      goto LAB_00101613;
    case 2:
      uVar15 = uVar11 >> 5;
      if ((uVar11 & 0x18) == 0) {
        pcVar17 = _huff_tab7 + ((uint)uVar15 & 3);
LAB_001014fc:
        sVar9 = 7;
      }
      else {
        cVar12 = _huff_tab5[uVar3 & 3];
        if (cVar12 != '\0') goto LAB_00101619;
        pcVar17 = _huff_tab6 + ((uint)uVar15 & 1);
        sVar9 = 6;
      }
      goto LAB_00101613;
    default:
      cVar12 = _huff_tab1[(uint)uVar11 & 7];
      if (cVar12 != '\0') goto LAB_00101619;
      pcVar17 = _huff_tab2 + (uVar3 & 1);
      break;
    case 4:
      pcVar17 = _huff_tab4 + (uVar3 & 1);
      break;
    case 5:
      pcVar17 = _huff_tab3 + (uVar3 & 1);
    }
    sVar9 = 4;
LAB_00101613:
    cVar12 = *pcVar17;
    uVar15 = uVar11 >> sVar9;
LAB_00101619:
    uVar16 = uVar14 >> 3;
    uVar3 = (uint)uVar16;
    switch((uint)uVar14 & 7) {
    case 0:
      uVar16 = uVar14 >> 5;
      uVar10 = (uint)uVar16;
      if ((uVar14 & 0x18) != 0) {
        cVar13 = _huff_tab9[uVar3 & 3];
        if (cVar13 == '\0') {
          pcVar17 = _huff_tab10 + (uVar10 & 3);
          goto LAB_00101706;
        }
        goto LAB_001016e8;
      }
      uVar16 = uVar14 >> 7;
      uVar3 = (uint)uVar16;
      if ((uVar14 & 0x60) != 0) {
        cVar13 = _huff_tab11[uVar10 & 3];
        if (cVar13 != '\0') goto LAB_001016e8;
        pcVar17 = _huff_tab12 + (uVar3 & 1);
        sVar9 = 8;
        goto LAB_001016df;
      }
      uVar16 = uVar14 >> 10;
      uVar10 = (uint)uVar16;
      switch(uVar3 & 7) {
      case 0:
        uVar16 = uVar14 >> 0xc;
        if ((uVar14 & 0xc00) == 0) {
          pcVar17 = _huff_tab21 + ((uint)uVar16 & 7);
          sVar9 = 0xf;
        }
        else {
          cVar13 = _huff_tab19[uVar10 & 3];
          if (cVar13 != '\x01') goto LAB_001016e8;
          pcVar17 = _huff_tab20 + ((uint)uVar16 & 7);
          sVar9 = 0xf;
        }
        break;
      case 1:
        pcVar17 = _huff_tab18 + (uVar10 & 0xf);
        goto LAB_00101812;
      case 2:
        pcVar17 = _huff_tab17 + (uVar10 & 0x1f);
        sVar9 = 0xf;
        break;
      default:
        cVar13 = _huff_tab13[uVar3 & 7];
        if (cVar13 != '\0') goto LAB_001016e8;
        pcVar17 = _huff_tab14 + (uVar10 & 1);
        sVar9 = 0xb;
        break;
      case 4:
        pcVar17 = _huff_tab16 + (uVar10 & 0xf);
        goto LAB_00101812;
      case 5:
        pcVar17 = _huff_tab15 + (uVar10 & 0xf);
LAB_00101812:
        sVar9 = 0xe;
      }
      goto LAB_001016df;
    case 1:
      pcVar17 = _huff_tab8 + (uVar3 & 3);
      sVar9 = 5;
      goto LAB_001016df;
    case 2:
      uVar16 = uVar14 >> 5;
      if ((uVar14 & 0x18) == 0) {
        pcVar17 = _huff_tab7 + ((uint)uVar16 & 3);
LAB_00101706:
        sVar9 = 7;
      }
      else {
        cVar13 = _huff_tab5[uVar3 & 3];
        if (cVar13 != '\0') goto LAB_001016e8;
        pcVar17 = _huff_tab6 + ((uint)uVar16 & 1);
        sVar9 = 6;
      }
      goto LAB_001016df;
    default:
      cVar13 = _huff_tab1[(uint)uVar14 & 7];
      if (cVar13 != '\0') goto LAB_001016e8;
      pcVar17 = _huff_tab2 + (uVar3 & 1);
      break;
    case 4:
      pcVar17 = _huff_tab4 + (uVar3 & 1);
      break;
    case 5:
      pcVar17 = _huff_tab3 + (uVar3 & 1);
    }
    sVar9 = 4;
LAB_001016df:
    cVar13 = *pcVar17;
    uVar16 = uVar14 >> sVar9;
LAB_001016e8:
    iVar4 = (int)cVar12 - (int)cVar13;
    uVar11 = uVar15;
    uVar14 = uVar16;
  } while (iVar4 == 0);
  return (long)iVar4;
}

Assistant:

static sexp_sint_t sexp_object_compare (sexp ctx, sexp a, sexp b, int depth) {
  sexp ls1, ls2;
  sexp_sint_t i, res, len;
  if (a == b)
    return 0;
  if (sexp_pointerp(a)) {
    if (sexp_pointerp(b)) {
      if (sexp_pointer_tag(a) == sexp_pointer_tag(b)) {
        if (depth <= 0)
          return 0;
        switch (sexp_pointer_tag(a)) {
#if SEXP_USE_FLONUMS
        case SEXP_FLONUM:
          res = sexp_flonum_value(a) > sexp_flonum_value(b) ? 1 :
                sexp_flonum_value(a) < sexp_flonum_value(b) ? -1 : 0;
          break;
#endif
#if SEXP_USE_BIGNUMS
        case SEXP_BIGNUM:
          res = sexp_bignum_compare(a, b);
          break;
#endif
#if SEXP_USE_RATIOS
        case SEXP_RATIO:
          res = sexp_unbox_fixnum(sexp_ratio_compare(ctx, a, b));
          break;
#endif
#if SEXP_USE_COMPLEX
        case SEXP_COMPLEX:
          res = sexp_object_compare(ctx, sexp_complex_real(a), sexp_complex_real(b), depth-1);
          if (res==0) res = sexp_object_compare(ctx, sexp_complex_imag(a), sexp_complex_imag(b), depth-1);
          break;
#endif
        case SEXP_STRING:
          res = strcmp(sexp_string_data(a), sexp_string_data(b));
          break;
        case SEXP_SYMBOL:
          res = strcmp(sexp_lsymbol_data(a), sexp_lsymbol_data(b));
          break;
        case SEXP_PAIR:
          for (res=0, ls1=a, ls2=sexp_cdr(a); res == 0 && ls1 != ls2 && sexp_pairp(ls1) && sexp_pairp(b) && sexp_pairp(b); ls1=sexp_cdr(ls1), ls2=((sexp_pairp(ls2)&&sexp_pairp(sexp_cdr(ls2)))?sexp_cdr(ls2):SEXP_NULL), b=sexp_cdr(b))
            res = sexp_object_compare(ctx, sexp_car(ls1), sexp_car(b), depth-1);
          if (sexp_pairp(ls2) && !sexp_pairp(b))
            res = 1;
          else if (sexp_pairp(b) && !sexp_pairp(ls2))
            res = -1;
          else if (ls1==SEXP_NULL && b==SEXP_NULL)
            res = 0;
          else if (res == 0)
            res = sexp_object_compare(ctx, ls1, b, depth-1);
          break;
        case SEXP_VECTOR:
          len = sexp_vector_length(a);
          res = len - sexp_vector_length(b);
          for (i=0; res == 0 && i < len; ++i)
            res = sexp_object_compare(ctx, sexp_vector_ref(a, sexp_make_fixnum(i)), sexp_vector_ref(b, sexp_make_fixnum(i)), depth-1);
          break;
        default:
          res = 0;
          break;
        }
      } else if (sexp_non_immediate_ordered_numberp(a) &&
                 sexp_non_immediate_ordered_numberp(b)) {
        res = sexp_unbox_fixnum(sexp_compare(ctx, a, b));
      } else {
        res = sexp_pointer_tag(a) - sexp_pointer_tag(b);
      }
#if SEXP_USE_BIGNUMS || SEXP_USE_FLONUMS
    } else if (sexp_fixnump(b) && sexp_non_immediate_ordered_numberp(a)) {
      res = sexp_unbox_fixnum(sexp_compare(ctx, a, b));
#endif
#if SEXP_USE_HUFF_SYMS
    } else if (sexp_isymbolp(b) && sexp_lsymbolp(a)) {
      res = strcmp(sexp_lsymbol_data(a),
                   sexp_string_data(sexp_write_to_string(ctx, b)));
#endif
    } else {
      res = 1;
    }
  } else if (sexp_pointerp(b)) {
#if SEXP_USE_BIGNUMS || SEXP_USE_FLONUMS
    if (sexp_fixnump(a) && sexp_non_immediate_ordered_numberp(b))
      res = sexp_unbox_fixnum(sexp_compare(ctx, a, b));
    else
#endif
#if SEXP_USE_HUFF_SYMS
    if (sexp_isymbolp(a) && sexp_lsymbolp(b))
      res = strcmp(sexp_string_data(sexp_write_to_string(ctx, a)),
                   sexp_lsymbol_data(b));
    else
#endif
      res = -1;
  } else {
#if SEXP_USE_HUFF_SYMS
    if (sexp_isymbolp(a) && sexp_isymbolp(b))
      return sexp_isymbol_compare(ctx, a, b);
    else
#endif
      res = (sexp_sint_t)a - (sexp_sint_t)b;
  }
  return res;
}